

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Point3<float> __thiscall
pbrt::Permute<pbrt::Point3,float>(pbrt *this,Tuple3<pbrt::Point3,_float> *t,array<int,_3> p)

{
  undefined1 auVar1 [16];
  pbrt *ppVar2;
  int iVar3;
  pbrt *ppVar4;
  Point3<float> PVar5;
  
  ppVar2 = this;
  if ((int)t != 0) {
    if ((int)t == 1) {
      ppVar2 = this + 4;
    }
    else {
      ppVar2 = this + 8;
    }
  }
  iVar3 = (int)((ulong)t >> 0x20);
  ppVar4 = this;
  if (iVar3 != 0) {
    if (iVar3 == 1) {
      ppVar4 = this + 4;
    }
    else {
      ppVar4 = this + 8;
    }
  }
  if (p.values[0] != 0) {
    if (p.values[0] == 1) {
      this = this + 4;
    }
    else {
      this = this + 8;
    }
  }
  auVar1 = vinsertps_avx(ZEXT416(*(uint *)ppVar2),ZEXT416(*(uint *)ppVar4),0x10);
  PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar1._0_8_;
  PVar5.super_Tuple3<pbrt::Point3,_float>.z = *(float *)this;
  return (Point3<float>)PVar5.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

PBRT_CPU_GPU inline C<T> Permute(const Tuple3<C, T> &t, pstd::array<int, 3> p) {
    return {t[p[0]], t[p[1]], t[p[2]]};
}